

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O0

wchar_t textui_get_quantity(char *prompt,wchar_t max)

{
  _Bool _Var1;
  ushort **ppuVar2;
  byte local_c8 [8];
  char buf [80];
  char tmp [80];
  wchar_t local_20;
  wchar_t amt;
  wchar_t max_local;
  char *prompt_local;
  
  local_20 = L'\x01';
  if (max != L'\x01') {
    _amt = prompt;
    if (prompt == (char *)0x0) {
      strnfmt(buf + 0x48,0x50,"Quantity (0-%d, *=all): ",(ulong)(uint)max);
      _amt = buf + 0x48;
    }
    strnfmt((char *)local_c8,0x50,"%d",1);
    _Var1 = get_string(_amt,(char *)local_c8,7);
    if (!_Var1) {
      return L'\0';
    }
    local_20 = atoi((char *)local_c8);
    if ((local_c8[0] == 0x2a) ||
       (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)local_c8[0]] & 0x400) != 0)) {
      local_20 = max;
    }
  }
  if (max < local_20) {
    local_20 = max;
  }
  if (local_20 < L'\0') {
    local_20 = L'\0';
  }
  return local_20;
}

Assistant:

static int textui_get_quantity(const char *prompt, int max)
{
	int amt = 1;

	/* Prompt if needed */
	if (max != 1) {
		char tmp[80];
		char buf[80];

		/* Build a prompt if needed */
		if (!prompt) {
			/* Build a prompt */
			strnfmt(tmp, sizeof(tmp), "Quantity (0-%d, *=all): ", max);

			/* Use that prompt */
			prompt = tmp;
		}

		/* Build the default */
		strnfmt(buf, sizeof(buf), "%d", amt);

		/* Ask for a quantity */
		if (!get_string(prompt, buf, 7)) return (0);

		/* Extract a number */
		amt = atoi(buf);

		/* A star or letter means "all" */
		if ((buf[0] == '*') || isalpha((unsigned char)buf[0])) amt = max;
	}

	/* Enforce the maximum */
	if (amt > max) amt = max;

	/* Enforce the minimum */
	if (amt < 0) amt = 0;

	/* Return the result */
	return (amt);
}